

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  const_reference pvVar5;
  string *psVar6;
  undefined4 extraout_var;
  pointer this_01;
  ulong uVar7;
  allocator<char> local_21a;
  undefined1 local_219;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_> local_218;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_1f0;
  string local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *property_value;
  cmCustomCommandGenerator *ccg_local;
  cmLocalNinjaGenerator *this_local;
  string *launcher;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  property_value = (char *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"RULE_LAUNCH_CUSTOM",&local_49);
  pcVar4 = cmMakefile::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pcVar4;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&output.field_2 + 8));
    std::__cxx11::string::string((string *)&outputs);
    local_1b0 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)property_value);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_1b0);
    if (!bVar1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_1b0,0);
      std::__cxx11::string::operator=((string *)&outputs,(string *)pvVar5);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
                (&local_1d0,(cmCustomCommandGenerator *)property_value);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_1d0);
      if ((bVar2 & 1) != 0) {
        psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_1f0,(cmLocalGenerator *)this,psVar6,(string *)&outputs);
        std::__cxx11::string::operator=((string *)&outputs,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&rulePlaceholderExpander,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)&outputs,SHELL);
      std::__cxx11::string::operator=((string *)&outputs,(string *)&rulePlaceholderExpander);
      std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
    }
    std::__cxx11::string::c_str();
    iVar3 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      ();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&local_218,(pointer)CONCAT44(extraout_var,iVar3));
    pcVar4 = local_28;
    local_219 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,&local_21a);
    std::allocator<char>::~allocator(&local_21a);
    this_01 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::operator->(&local_218);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (this_01,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,__return_storage_ptr__,
               (RuleVariables *)((long)&output.field_2 + 8));
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    local_219 = 1;
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr(&local_218);
    std::__cxx11::string::~string((string *)&outputs);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property_value =
    this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!property_value || !*property_value) {
    return std::string();
  }

  // Expand rule variables referenced in the given launcher command.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output = this->MaybeConvertToRelativePath(
        this->GetCurrentBinaryDirectory(), output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  std::string launcher = property_value;
  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}